

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  uint *puVar1;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  SourceLocation SVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined7 in_register_00000081;
  __extent_storage<18446744073709551615UL> _Var10;
  ulong in_R9;
  SourceRange SVar11;
  SourceRange SVar12;
  undefined4 in_stack_ffffffffffffffa8;
  
  _Var10._M_extent_value = CONCAT71(in_register_00000081,isStart);
  uVar3 = loc._0_4_ & 0xfffffff;
  uVar8 = (uint)sm & 0xfffffff;
  if (uVar8 != uVar3) {
    puVar1 = (uint *)(_Var10._M_extent_value + in_R9 * 4);
    do {
      bVar2 = SourceManager::isMacroLoc((SourceManager *)this,(SourceLocation)sm);
      if (!bVar2) {
        return (SourceLocation)0x0;
      }
      bVar2 = SourceManager::isMacroArgLoc((SourceManager *)this,(SourceLocation)sm);
      if (bVar2) {
        puVar5 = (uint *)_Var10._M_extent_value;
        puVar4 = (uint *)_Var10._M_extent_value;
        uVar9 = in_R9;
        if (0 < (long)in_R9) {
          do {
            uVar7 = uVar9 >> 1;
            uVar9 = ~uVar7 + uVar9;
            puVar5 = puVar4 + uVar7 + 1;
            if (uVar8 <= puVar4[uVar7]) {
              uVar9 = uVar7;
              puVar5 = puVar4;
            }
            puVar4 = puVar5;
          } while (0 < (long)uVar9);
        }
        if ((puVar5 == puVar1) || (uVar8 < *puVar5)) {
          SVar6 = (SourceLocation)0x0;
        }
        else {
          SVar6 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        }
        SVar11.endLoc = SVar6;
        SVar11.startLoc = SVar6;
        SVar12 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
      }
      else {
        SVar11 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
        SVar6 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        SVar12.endLoc = SVar6;
        SVar12.startLoc = SVar6;
      }
      SVar6 = SVar11.endLoc;
      if (contextLoc._0_1_ != '\0') {
        SVar6 = SVar11.startLoc;
      }
      if ((((ulong)SVar6 & 0xfffffff) != 0) &&
         (commonArgs_00._M_ptr._4_4_ = uVar3, commonArgs_00._M_ptr._0_4_ = in_stack_ffffffffffffffa8
         , commonArgs_00._M_extent._M_extent_value = _Var10._M_extent_value,
         SVar6 = getMatchingMacroLoc(this,(SourceManager *)SVar6,loc,
                                     (SourceLocation)((ulong)contextLoc & 0xff),
                                     SUB81(_Var10._M_extent_value,0),commonArgs_00),
         ((ulong)SVar6 & 0xfffffff) != 0)) {
        return SVar6;
      }
      sm = (SourceManager *)SVar12.endLoc;
      if (contextLoc._0_1_ != '\0') {
        sm = (SourceManager *)SVar12.startLoc;
      }
      uVar8 = (uint)sm & 0xfffffff;
    } while (uVar8 != uVar3);
  }
  return (SourceLocation)sm;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          std::span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::ranges::binary_search(commonArgs, loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}